

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_pcg.c
# Opt level: O1

int SUNLinSolSolve_PCG(SUNLinearSolver S,SUNMatrix nul,N_Vector x,N_Vector b,sunrealtype delta)

{
  int *piVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  code *pcVar9;
  code *pcVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double __x;
  undefined4 local_48;
  
  piVar1 = (int *)S->content;
  iVar13 = *piVar1;
  iVar14 = piVar1[1];
  uVar2 = *(undefined8 *)(piVar1 + 0x14);
  uVar3 = *(undefined8 *)(piVar1 + 0x16);
  uVar4 = *(undefined8 *)(piVar1 + 0x18);
  uVar5 = *(undefined8 *)(piVar1 + 0x1a);
  lVar6 = *(long *)(piVar1 + 0x12);
  uVar7 = *(undefined8 *)(piVar1 + 10);
  uVar8 = *(undefined8 *)(piVar1 + 0x10);
  pcVar9 = *(code **)(piVar1 + 8);
  pcVar10 = *(code **)(piVar1 + 0xe);
  piVar1[3] = 0;
  if (piVar1[2] == 0) {
    iVar12 = (*pcVar9)(uVar7,x,uVar2);
    if (iVar12 == 0) {
      N_VLinearSum(0x3ff0000000000000,b,uVar2,uVar2);
      goto LAB_00119c1a;
    }
    piVar1[2] = 0;
LAB_00119d69:
    iVar14 = -0x325;
    iVar13 = 0x323;
  }
  else {
    N_VScale(0x3ff0000000000000,b,uVar2);
LAB_00119c1a:
    if (lVar6 == 0) {
      N_VScale(0x3ff0000000000000,uVar2,uVar5);
    }
    else {
      N_VProd(uVar2,lVar6,uVar5);
    }
    dVar16 = (double)N_VDotProd(uVar5,uVar5);
    dVar17 = 0.0;
    if (0.0 < dVar16) {
      if (dVar16 < 0.0) {
        dVar17 = sqrt(dVar16);
      }
      else {
        dVar17 = SQRT(dVar16);
      }
    }
    *(double *)(piVar1 + 4) = dVar17;
    if (dVar17 <= delta) {
      iVar13 = 0;
      piVar1[2] = 0;
      goto LAB_00119d76;
    }
    if (2 < iVar14 - 1U) {
      N_VScale(0x3ff0000000000000,uVar2,uVar4);
LAB_00119d14:
      dVar16 = (double)N_VDotProd(uVar2,uVar4);
      N_VScale(0x3ff0000000000000,uVar4,uVar3);
      if (iVar13 < 1) {
        bVar11 = false;
        dVar18 = dVar17;
LAB_00119dd2:
        piVar1[2] = 0;
        if (bVar11) {
          *(undefined4 *)((long)S->content + 0x18) = 0;
        }
        else if (dVar17 <= dVar18) {
          *(undefined4 *)((long)S->content + 0x18) = 0x322;
        }
        else {
          *(undefined4 *)((long)S->content + 0x18) = 0x321;
        }
        return *(int *)((long)S->content + 0x18);
      }
      piVar1[3] = piVar1[3] + 1;
      iVar12 = (*pcVar9)(uVar7,uVar3,uVar5);
      if (iVar12 == 0) {
        iVar15 = 0;
        do {
          dVar18 = (double)N_VDotProd(uVar5,uVar3);
          if ((iVar15 == 0) && (piVar1[2] != 0)) {
            N_VScale(dVar16 / dVar18,uVar3,x);
          }
          else {
            N_VLinearSum(0x3ff0000000000000,x,uVar3,x);
          }
          local_48 = SUB84(dVar16 / dVar18,0);
          N_VLinearSum(0x3ff0000000000000,local_48,uVar2,uVar5,uVar2);
          if (lVar6 == 0) {
            N_VScale(0x3ff0000000000000,uVar2,uVar5);
          }
          else {
            N_VProd(uVar2,lVar6,uVar5);
          }
          __x = (double)N_VDotProd(uVar5,uVar5);
          dVar18 = 0.0;
          if (0.0 < __x) {
            if (__x < 0.0) {
              dVar18 = sqrt(__x);
            }
            else {
              dVar18 = SQRT(__x);
            }
          }
          *(double *)(piVar1 + 4) = dVar18;
          bVar11 = dVar18 <= delta;
          if ((bVar11) || (iVar13 + -1 == iVar15)) goto LAB_00119dd2;
          if (iVar14 - 1U < 3) {
            iVar12 = (*pcVar10)(delta,uVar8,uVar2,uVar4,1);
            if (iVar12 != 0) goto LAB_00119ce7;
          }
          else {
            N_VScale(0x3ff0000000000000,uVar2,uVar4);
          }
          dVar18 = (double)N_VDotProd(uVar2,uVar4);
          N_VLinearSum(0x3ff0000000000000,SUB84(dVar18 / dVar16,0),uVar4,uVar3,uVar3);
          iVar15 = iVar15 + 1;
          piVar1[3] = piVar1[3] + 1;
          iVar12 = (*pcVar9)(uVar7,uVar3,uVar5);
          dVar16 = dVar18;
        } while (iVar12 == 0);
      }
      piVar1[2] = 0;
      goto LAB_00119d69;
    }
    iVar12 = (*pcVar10)(delta,uVar8,uVar2,uVar4,1);
    if (iVar12 == 0) goto LAB_00119d14;
LAB_00119ce7:
    piVar1[2] = 0;
    iVar14 = -0x328;
    iVar13 = 0x325;
  }
  if (iVar12 < 0) {
    iVar13 = iVar14;
  }
LAB_00119d76:
  *(int *)((long)S->content + 0x18) = iVar13;
  return iVar13;
}

Assistant:

int SUNLinSolSolve_PCG(SUNLinearSolver S, SUNDIALS_MAYBE_UNUSED SUNMatrix nul,
                       N_Vector x, N_Vector b, sunrealtype delta)
{
  SUNFunctionBegin(S->sunctx);

  /* local data and shortcut variables */
  sunrealtype alpha, beta, r0_norm, rho, rz, rz_old;
  N_Vector r, p, z, Ap, w;
  sunbooleantype UsePrec, UseScaling, converged;
  sunbooleantype* zeroguess;
  int l, l_max, pretype;
  void *A_data, *P_data;
  SUNATimesFn atimes;
  SUNPSolveFn psolve;
  sunrealtype* res_norm;
  int* nli;
  int status;

  /* Make local shorcuts to solver variables. */
  l_max     = PCG_CONTENT(S)->maxl;
  r         = PCG_CONTENT(S)->r;
  p         = PCG_CONTENT(S)->p;
  z         = PCG_CONTENT(S)->z;
  Ap        = PCG_CONTENT(S)->Ap;
  w         = PCG_CONTENT(S)->s;
  A_data    = PCG_CONTENT(S)->ATData;
  P_data    = PCG_CONTENT(S)->PData;
  atimes    = PCG_CONTENT(S)->ATimes;
  psolve    = PCG_CONTENT(S)->Psolve;
  pretype   = PCG_CONTENT(S)->pretype;
  zeroguess = &(PCG_CONTENT(S)->zeroguess);
  nli       = &(PCG_CONTENT(S)->numiters);
  res_norm  = &(PCG_CONTENT(S)->resnorm);

  /* Initialize counters and convergence flag */
  *nli      = 0;
  converged = SUNFALSE;

  /* set sunbooleantype flags for internal solver options */
  UsePrec    = ((pretype == SUN_PREC_BOTH) || (pretype == SUN_PREC_LEFT) ||
             (pretype == SUN_PREC_RIGHT));
  UseScaling = (w != NULL);

  /* Check if Atimes function has been set */
  SUNAssert(atimes, SUN_ERR_ARG_CORRUPT);

  /* If preconditioning, check if psolve has been set */
  SUNAssert(!UsePrec || psolve, SUN_ERR_ARG_CORRUPT);

  /* Set r to initial residual r_0 = b - A*x_0 */
  if (*zeroguess)
  {
    N_VScale(ONE, b, r);
    SUNCheckLastErr();
  }
  else
  {
    status = atimes(A_data, x, r);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                 : SUNLS_ATIMES_FAIL_REC;
      return (LASTFLAG(S));
    }
    N_VLinearSum(ONE, b, -ONE, r, r);
    SUNCheckLastErr();
  }

  /* Set rho to scaled L2 norm of r, and return if small */
  if (UseScaling)
  {
    N_VProd(r, w, Ap);
    SUNCheckLastErr();
  }
  else
  {
    N_VScale(ONE, r, Ap);
    SUNCheckLastErr();
  }
  rho = N_VDotProd(Ap, Ap);
  SUNCheckLastErr();
  *res_norm = r0_norm = rho = SUNRsqrt(rho);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  SUNLogger_QueueMsg(S->sunctx->logger, SUN_LOGLEVEL_INFO, "SUNLinSolSolve_PCG",
                     "initial-residual", "nli = %li, resnorm = %.16g",
                     (long int)0, *res_norm);
#endif

  if (rho <= delta)
  {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUN_SUCCESS;
    return (LASTFLAG(S));
  }

  /* Apply preconditioner and b-scaling to r = r_0 */
  if (UsePrec)
  {
    status = psolve(P_data, r, z, delta, SUN_PREC_LEFT); /* z = P^{-1}r */
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                 : SUNLS_PSOLVE_FAIL_REC;
      return (LASTFLAG(S));
    }
  }
  else
  {
    N_VScale(ONE, r, z);
    SUNCheckLastErr();
  }

  /* Initialize rz to <r,z> */
  rz = N_VDotProd(r, z);
  SUNCheckLastErr();

  /* Copy z to p */
  N_VScale(ONE, z, p);
  SUNCheckLastErr();

  /* Begin main iteration loop */
  for (l = 0; l < l_max; l++)
  {
    /* increment counter */
    (*nli)++;

    /* Generate Ap = A*p */
    status = atimes(A_data, p, Ap);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                 : SUNLS_ATIMES_FAIL_REC;
      return (LASTFLAG(S));
    }

    /* Calculate alpha = <r,z> / <Ap,p> */
    alpha = N_VDotProd(Ap, p);
    SUNCheckLastErr();
    alpha = rz / alpha;

    /* Update x = x + alpha*p */
    if (l == 0 && *zeroguess)
    {
      N_VScale(alpha, p, x);
      SUNCheckLastErr();
    }
    else
    {
      N_VLinearSum(ONE, x, alpha, p, x);
      SUNCheckLastErr();
    }

    /* Update r = r - alpha*Ap */
    N_VLinearSum(ONE, r, -alpha, Ap, r);
    SUNCheckLastErr();

    /* Set rho and check convergence */
    if (UseScaling)
    {
      N_VProd(r, w, Ap);
      SUNCheckLastErr();
    }
    else
    {
      N_VScale(ONE, r, Ap);
      SUNCheckLastErr();
    }
    rho = N_VDotProd(Ap, Ap);
    SUNCheckLastErr();
    *res_norm = rho = SUNRsqrt(rho);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
    SUNLogger_QueueMsg(S->sunctx->logger, SUN_LOGLEVEL_INFO,
                       "SUNLinSolSolve_PCG", "iterate-residual",
                       "nli = %li, resnorm = %.16g", (long int)0, *res_norm);
#endif

    if (rho <= delta)
    {
      converged = SUNTRUE;
      break;
    }

    /* Exit early on last iteration */
    if (l == l_max - 1) { break; }

    /* Apply preconditioner:  z = P^{-1}*r */
    if (UsePrec)
    {
      status = psolve(P_data, r, z, delta, SUN_PREC_LEFT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;
        return (LASTFLAG(S));
      }
    }
    else
    {
      N_VScale(ONE, r, z);
      SUNCheckLastErr();
    }

    /* update rz */
    rz_old = rz;
    rz     = N_VDotProd(r, z);
    SUNCheckLastErr();

    /* Calculate beta = <r,z> / <r_old,z_old> */
    beta = rz / rz_old;

    /* Update p = z + beta*p */
    N_VLinearSum(ONE, z, beta, p, p);
    SUNCheckLastErr();
  }

  /* Main loop finished, return with result */
  *zeroguess = SUNFALSE;
  if (converged == SUNTRUE) { LASTFLAG(S) = SUN_SUCCESS; }
  else if (rho < r0_norm) { LASTFLAG(S) = SUNLS_RES_REDUCED; }
  else { LASTFLAG(S) = SUNLS_CONV_FAIL; }
  return (LASTFLAG(S));
}